

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_alloc_helpers.hpp
# Opt level: O0

void asio_handler_alloc_helpers::deallocate<mau::ProxySession::postNextTimer()::__0>
               (void *p,size_t s,anon_class_8_1_8991fb9c *h)

{
  undefined8 in_RDX;
  size_t in_RSI;
  void *in_RDI;
  
  asio::asio_handler_deallocate(in_RDI,in_RSI,in_RDX);
  return;
}

Assistant:

inline void deallocate(void* p, std::size_t s, Handler& h)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  ::operator delete(p);
#else
  using asio::asio_handler_deallocate;
  asio_handler_deallocate(p, s, asio::detail::addressof(h));
#endif
}